

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sph.cpp
# Opt level: O0

KHType __thiscall
Pearson8x8::operator()
          (Pearson8x8 *this,string *keyword,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *mixTable,size_t pkSize)

{
  KHType KVar1;
  function<unsigned_char_(const_char_*,_const_unsigned_char_*,_unsigned_long)> local_50;
  size_t local_30;
  size_t pkSize_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *mixTable_local;
  string *keyword_local;
  Pearson8x8 *this_local;
  
  local_30 = pkSize;
  pkSize_local = (size_t)mixTable;
  mixTable_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)keyword;
  keyword_local = (string *)this;
  std::function<unsigned_char(char_const*,unsigned_char_const*,unsigned_long)>::
  function<unsigned_char(&)(char_const*,unsigned_char_const*,unsigned_long),void>
            ((function<unsigned_char(char_const*,unsigned_char_const*,unsigned_long)> *)&local_50,
             hash);
  this_local._6_2_ = HashInfix<unsigned_char,unsigned_char>(keyword,mixTable,pkSize,&local_50);
  std::function<unsigned_char_(const_char_*,_const_unsigned_char_*,_unsigned_long)>::~function
            (&local_50);
  KVar1.key = this_local._6_1_;
  KVar1.hash = this_local._7_1_;
  return KVar1;
}

Assistant:

KHType operator()(const string & keyword, const vector<Key> & mixTable, const size_t pkSize)
    {
        return HashInfix<Key, Hash>(keyword, mixTable, pkSize, hash);
    }